

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_open_uri.cxx
# Opt level: O1

void fl_decode_uri(char *uri)

{
  int iVar1;
  undefined8 in_RAX;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  int h;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  sVar2 = strlen(uri);
  pcVar4 = uri + (sVar2 - 2);
  if (uri < pcVar4) {
    pcVar3 = uri + sVar2;
    lVar5 = -2 - (long)uri;
    do {
      if (*uri == '%') {
        iVar1 = __isoc99_sscanf(uri + 1,"%2X",(long)&uStack_38 + 4);
        if (iVar1 != 1) {
          return;
        }
        *uri = uStack_38._4_1_;
        memmove(uri + 1,uri + 3,(size_t)(pcVar3 + lVar5));
        pcVar3 = pcVar4;
      }
      uri = uri + 1;
      pcVar4 = pcVar3 + -2;
      lVar5 = lVar5 + -1;
    } while (uri < pcVar4);
  }
  return;
}

Assistant:

void fl_decode_uri(char *uri)
{
  char *last = uri + strlen(uri);
  while (uri < last-2) {
    if (*uri == '%') {
      int h;
      if ( sscanf(uri+1, "%2X", &h) != 1 ) break;
      *uri = h;
      memmove(uri+1, uri+3, last - (uri+2));
      last -= 2;
    }
    uri++;
  }
}